

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O0

void test_next_bits_iterate(void)

{
  size_t expected;
  size_t j;
  size_t startfrom;
  size_t i;
  size_t howmany;
  size_t buffer [3];
  int i_2;
  int i_1;
  bitset_t *b;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  bitset_t *in_stack_ffffffffffffffb0;
  size_t *in_stack_ffffffffffffffb8;
  unsigned_long a;
  bitset_t *local_38;
  size_t *startfrom_00;
  size_t in_stack_ffffffffffffffd8;
  size_t *in_stack_ffffffffffffffe0;
  bitset_t *in_stack_ffffffffffffffe8;
  int local_10;
  int local_c;
  
  bitset_create();
  for (local_c = 0; local_c < 100; local_c = local_c + 1) {
    bitset_set(in_stack_ffffffffffffffb0,
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  for (local_10 = 1000; local_10 < 0x44c; local_10 = local_10 + 2) {
    bitset_set(in_stack_ffffffffffffffb0,
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  startfrom_00 = (size_t *)0x0;
  local_38 = (bitset_t *)0x0;
  a = 0;
  while (startfrom_00 = (size_t *)
                        bitset_next_set_bits
                                  (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                                   in_stack_ffffffffffffffd8,startfrom_00),
        startfrom_00 != (size_t *)0x0) {
    for (in_stack_ffffffffffffffb8 = (size_t *)0x0; in_stack_ffffffffffffffb8 < startfrom_00;
        in_stack_ffffffffffffffb8 = (size_t *)((long)in_stack_ffffffffffffffb8 + 1)) {
      in_stack_ffffffffffffffb0 = local_38;
      if ((bitset_t *)0x63 < local_38) {
        in_stack_ffffffffffffffb0 =
             (bitset_t *)((long)((long)&local_38[-5].capacity + 4) * 2 + 1000);
      }
      _assert_int_equal(a,(unsigned_long)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0
                        ,in_stack_ffffffffffffffac);
      local_38 = (bitset_t *)((long)&local_38->array + 1);
    }
    a = a + 1;
  }
  _assert_int_equal(a,(unsigned_long)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                    in_stack_ffffffffffffffac);
  bitset_free((bitset_t *)0x102ca2);
  return;
}

Assistant:

DEFINE_TEST(test_next_bits_iterate) {
    bitset_t *b = bitset_create();
    for (int i = 0; i < 100; i++) bitset_set(b, i);
    for (int i = 1000; i < 1100; i += 2) bitset_set(b, i);

    // Use an odd, small buffer size
    size_t buffer[3];
    size_t howmany = 0;
    size_t i = 0;
    for (size_t startfrom = 0;
         (howmany = bitset_next_set_bits(
              b, buffer, sizeof(buffer) / sizeof(buffer[0]), &startfrom)) > 0;
         startfrom++) {
        for (size_t j = 0; j < howmany; j++) {
            size_t expected;
            if (i < 100) {
                expected = i;
            } else {
                expected = 1000 + 2 * (i - 100);
            }
            assert_int_equal(buffer[j], expected);
            ++i;
        }
    }
    assert_int_equal(i, 150);
    bitset_free(b);
}